

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O3

void flatbuffers::tests::Offset64Test(void)

{
  bool expval;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_> off;
  Offset64<flatbuffers::String> off_00;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> off_01;
  uint *puVar1;
  ulong uVar2;
  int *piVar3;
  long *plVar4;
  ulong *puVar5;
  char *__function;
  int *piVar6;
  uoffset_t uVar7;
  pointer v;
  Offset<flatbuffers::String> off_02;
  uchar *v_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> big_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> far_data;
  FlatBufferBuilder64 builder;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  FlatBufferBuilderImpl<true> local_f8;
  VerifierTemplate<false> local_78;
  
  local_f8.buf_.allocator_ = (Allocator *)0x0;
  local_f8.buf_.own_allocator_ = false;
  local_f8.buf_.initial_size_ = 0x400;
  local_f8.buf_.max_size_ = 0x7fffffffffffffff;
  local_f8.buf_.buffer_minalign_ = 8;
  local_f8.length_of_64_bit_region_ = 0;
  local_f8.nested = false;
  local_f8.finished = false;
  local_f8.buf_.reserved_ = 0;
  local_f8.buf_.size_ = 0;
  local_f8.buf_.buf_ = (uint8_t *)0x0;
  local_f8.buf_.cur_._0_6_ = 0;
  local_f8.buf_.cur_._6_2_ = 0;
  local_f8.buf_.scratch_._0_6_ = 0;
  local_f8._78_8_ = 0;
  local_f8.minalign_ = 1;
  local_f8.force_defaults_ = false;
  local_f8.dedup_vtables_ = true;
  local_f8.string_pool = (StringOffsetMap *)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_118,4);
  *local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = '\x04';
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\x02';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_138,4);
  *local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = '\b';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\x03';
  v = local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start;
  if ((long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    v = &data<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)
         ::t;
  }
  off = FlatBufferBuilderImpl<true>::
        CreateVector<unsigned_char,_flatbuffers::Offset64,_flatbuffers::Vector>
                  (&local_f8,v,
                   (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  off_00 = FlatBufferBuilderImpl<true>::CreateString<flatbuffers::Offset64>
                     (&local_f8,"some far string");
  v_00 = &data<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)
          ::t;
  if ((long)local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    v_00 = local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  }
  off_01 = FlatBufferBuilderImpl<true>::
           CreateVector<unsigned_char,_flatbuffers::Offset64,_flatbuffers::Vector64>
                     (&local_f8,v_00,
                      (long)local_138.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_138.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  FlatBufferBuilderImpl<true>::CreateStringImpl(&local_f8,"some near string",0x10);
  off_02.o = (int)local_f8.buf_.size_ - (int)local_f8.length_of_64_bit_region_;
  FlatBufferBuilderImpl<true>::NotNested(&local_f8);
  local_f8.nested = true;
  uVar7 = (int)local_f8.buf_.size_ - (int)local_f8.length_of_64_bit_region_;
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_f8,0x16,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<LeafStruct_const*,unsigned_long>>
            (&local_f8,0x12,(Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_f8,0xe,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_f8,10,off_01);
  FlatBufferBuilderImpl<true>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,unsigned_int>>
            (&local_f8,0x14,
             (Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<LeafStruct_const*,unsigned_int>>
            (&local_f8,0x10,(Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::String>(&local_f8,0xc,off_02);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::String>(&local_f8,8,off_00);
  FlatBufferBuilderImpl<true>::AddElement<int>(&local_f8,6,0,0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>
            (&local_f8,4,off);
  uVar7 = FlatBufferBuilderImpl<true>::EndTable(&local_f8,uVar7);
  FlatBufferBuilderImpl<true>::Finish(&local_f8,uVar7,(char *)0x0,false);
  local_78.buf_ = FlatBufferBuilderImpl<true>::GetBufferPointer(&local_f8);
  local_78.size_ = local_f8.buf_.size_;
  local_78.opts_.max_depth = 0x40;
  local_78.opts_.max_tables = 1000000;
  local_78.opts_.check_alignment = true;
  local_78.opts_.check_nested_flatbuffers = true;
  local_78.opts_.max_size = 0x7fffffffffffffff;
  local_78.opts_.assert = true;
  local_78.upper_bound_ = 0;
  local_78.depth_ = 0;
  local_78.num_tables_ = 0;
  local_78.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  if (0x7ffffffffffffffe < local_f8.buf_.size_) {
    __assert_fail("size_ < opts.max_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/verifier.h"
                  ,0x2f,
                  "flatbuffers::VerifierTemplate<false>::VerifierTemplate(const uint8_t *const, const size_t, const Options &) [TrackVerifierBufferSize = false]"
                 );
  }
  expval = VerifierTemplate<false>::VerifyBufferFromStart<RootTable>(&local_78,(char *)0x0,0);
  TestEq<bool,bool>(expval,true,"\'VerifyRootTableBuffer(verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0x48,"");
  if (local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  puVar1 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer(&local_f8);
  if (puVar1 == (uint *)0x0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)((ulong)*puVar1 + (long)puVar1);
  }
  uVar2 = (ulong)*(ushort *)((long)piVar6 + (4 - (long)*piVar6));
  TestEq<unsigned_int,unsigned_long>
            (*(uint *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2),4,
             "\'root_table->far_vector()->size()\' != \'far_vector_size\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x4f,"");
  if ((*(ushort *)((long)piVar6 - (long)*piVar6) < 5) ||
     (uVar2 = (ulong)*(ushort *)((long)piVar6 + (4 - (long)*piVar6)), uVar2 == 0)) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2);
  }
  if (*piVar3 != 0) {
    TestEq<unsigned_char,int>
              ((uchar)piVar3[1],4,"\'root_table->far_vector()->Get(0)\' != \'4\'",
               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
               ,0x50,"");
    if ((*(ushort *)((long)piVar6 - (long)*piVar6) < 5) ||
       (uVar2 = (ulong)*(ushort *)((long)piVar6 + (4 - (long)*piVar6)), uVar2 == 0)) {
      puVar1 = (uint *)0x0;
    }
    else {
      puVar1 = (uint *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2);
    }
    if (3 < *puVar1) {
      TestEq<unsigned_char,int>
                (*(uchar *)((long)puVar1 + 7),2,
                 "\'root_table->far_vector()->Get(far_vector_size - 1)\' != \'2\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                 ,0x51,"");
      uVar2 = (ulong)*(ushort *)((long)piVar6 + (8 - (long)*piVar6));
      TestEqStr((char *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2 + 4),
                "some far string","\'root_table->far_string()->c_str()\' != \'\"some far string\"\'"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                ,0x53,"");
      uVar2 = (ulong)*(ushort *)((long)piVar6 + (10 - (long)*piVar6));
      TestEq<unsigned_long,unsigned_long>
                (*(unsigned_long *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2),4,
                 "\'root_table->big_vector()->size()\' != \'big_vector_size\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                 ,0x56,"");
      if ((*(ushort *)((long)piVar6 - (long)*piVar6) < 0xb) ||
         (uVar2 = (ulong)*(ushort *)((long)piVar6 + (10 - (long)*piVar6)), uVar2 == 0)) {
        plVar4 = (long *)0x0;
      }
      else {
        plVar4 = (long *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2);
      }
      if (*plVar4 != 0) {
        TestEq<unsigned_char,int>
                  ((uchar)plVar4[1],8,"\'root_table->big_vector()->Get(0)\' != \'8\'",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                   ,0x57,"");
        if ((*(ushort *)((long)piVar6 - (long)*piVar6) < 0xb) ||
           (uVar2 = (ulong)*(ushort *)((long)piVar6 + (10 - (long)*piVar6)), uVar2 == 0)) {
          puVar5 = (ulong *)0x0;
        }
        else {
          puVar5 = (ulong *)((long)piVar6 + *(long *)((long)piVar6 + uVar2) + uVar2);
        }
        if (3 < *puVar5) {
          TestEq<unsigned_char,int>
                    (*(uchar *)((long)puVar5 + 0xb),3,
                     "\'root_table->big_vector()->Get(big_vector_size - 1)\' != \'3\'",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                     ,0x58,"");
          uVar2 = (ulong)*(ushort *)((long)piVar6 + (0xc - (long)*piVar6));
          TestEqStr((char *)((long)piVar6 + *(uint *)((long)piVar6 + uVar2) + uVar2 + 4),
                    "some near string",
                    "\'root_table->near_string()->c_str()\' != \'\"some near string\"\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0x5a,"");
          FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl(&local_f8);
          return;
        }
      }
      __function = 
      "return_type flatbuffers::Vector<unsigned char, unsigned long>::Get(SizeT) const [T = unsigned char, SizeT = unsigned long]"
      ;
      goto LAB_001a951e;
    }
  }
  __function = 
  "return_type flatbuffers::Vector<unsigned char>::Get(SizeT) const [T = unsigned char, SizeT = unsigned int]"
  ;
LAB_001a951e:
  __assert_fail("i < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                ,0xc1,__function);
}

Assistant:

void Offset64Test() {
  FlatBufferBuilder64 builder;

  const size_t far_vector_size = 1LL << 2;
  // Make a large number if wanting to test a real large buffer.
  const size_t big_vector_size = 1LL << 2;

  {
    // First create the vectors that will be copied to the buffer.
    std::vector<uint8_t> far_data;
    far_data.resize(far_vector_size);
    far_data[0] = 4;
    far_data[far_vector_size - 1] = 2;

    std::vector<uint8_t> big_data;
    big_data.resize(big_vector_size);
    big_data[0] = 8;
    big_data[big_vector_size - 1] = 3;

    // Then serialize all the fields that have 64-bit offsets, as these must be
    // serialized before any 32-bit fields are added to the buffer.
    const Offset64<Vector<uint8_t>> far_vector_offset =
        builder.CreateVector64<Vector>(far_data);

    const Offset64<String> far_string_offset =
        builder.CreateString<Offset64>("some far string");

    const Offset64<Vector64<uint8_t>> big_vector_offset =
        builder.CreateVector64(big_data);

    // Now that we are done with the 64-bit fields, we can create and add the
    // normal fields.
    const Offset<String> near_string_offset =
        builder.CreateString("some near string");

    // Finish by building the root table by passing in all the offsets.
    const Offset<RootTable> root_table_offset =
        CreateRootTable(builder, far_vector_offset, 0, far_string_offset,
                        big_vector_offset, near_string_offset);

    // Finish the buffer.
    builder.Finish(root_table_offset);

    Verifier::Options options;
    // Allow the verifier to verify 64-bit buffers.
    options.max_size = FLATBUFFERS_MAX_64_BUFFER_SIZE;
    options.assert = true;

    Verifier verifier(builder.GetBufferPointer(), builder.GetSize(), options);

    TEST_EQ(VerifyRootTableBuffer(verifier), true);
  }

  {
    const RootTable *root_table = GetRootTable(builder.GetBufferPointer());

    // Expect the far vector to be properly sized.
    TEST_EQ(root_table->far_vector()->size(), far_vector_size);
    TEST_EQ(root_table->far_vector()->Get(0), 4);
    TEST_EQ(root_table->far_vector()->Get(far_vector_size - 1), 2);

    TEST_EQ_STR(root_table->far_string()->c_str(), "some far string");

    // Expect the big vector to be properly sized.
    TEST_EQ(root_table->big_vector()->size(), big_vector_size);
    TEST_EQ(root_table->big_vector()->Get(0), 8);
    TEST_EQ(root_table->big_vector()->Get(big_vector_size - 1), 3);

    TEST_EQ_STR(root_table->near_string()->c_str(), "some near string");
  }
}